

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt64(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
             *this,int64_t i64)

{
  char *buffer;
  char *pcVar1;
  
  buffer = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->os_->stack_,0x15);
  pcVar1 = internal::i64toa(i64,buffer);
  internal::Stack<rapidjson::CrtAllocator>::Pop<char>
            (&this->os_->stack_,(size_t)(buffer + (0x15 - (long)pcVar1)));
  return true;
}

Assistant:

inline bool Writer<StringBuffer>::WriteInt64(int64_t i64) {
    char *buffer = os_->Push(21);
    const char* end = internal::i64toa(i64, buffer);
    os_->Pop(static_cast<size_t>(21 - (end - buffer)));
    return true;
}